

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void validate_seg(CPUX86State *env,int seg_reg,int cpl)

{
  uint uVar1;
  
  if (((((seg_reg & 0xfffffffeU) != 4) || ((env->segs[(uint)seg_reg].selector & 0xfffc) != 0)) &&
      (uVar1 = env->segs[(uint)seg_reg].flags, (~uVar1 & 0xc00) != 0)) &&
     ((int)(uVar1 >> 0xd & 3) < cpl)) {
    cpu_x86_load_seg_cache(env,seg_reg,0,0,0,0);
    return;
  }
  return;
}

Assistant:

static inline void validate_seg(CPUX86State *env, int seg_reg, int cpl)
{
    int dpl;
    uint32_t e2;

    /* XXX: on x86_64, we do not want to nullify FS and GS because
       they may still contain a valid base. I would be interested to
       know how a real x86_64 CPU behaves */
    if ((seg_reg == R_FS || seg_reg == R_GS) &&
        (env->segs[seg_reg].selector & 0xfffc) == 0) {
        return;
    }

    e2 = env->segs[seg_reg].flags;
    dpl = (e2 >> DESC_DPL_SHIFT) & 3;
    if (!(e2 & DESC_CS_MASK) || !(e2 & DESC_C_MASK)) {
        /* data or non conforming code segment */
        if (dpl < cpl) {
            cpu_x86_load_seg_cache(env, seg_reg, 0, 0, 0, 0);
        }
    }
}